

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_buffer.cc
# Opt level: O1

void __thiscall webrtc::AudioBuffer::CopyLowPassToReference(AudioBuffer *this)

{
  unique_ptr<webrtc::ChannelBuffer<short>,_std::default_delete<webrtc::ChannelBuffer<short>_>_>
  *this_00;
  ChannelBuffer<short> *pCVar1;
  _Head_base<0UL,_webrtc::ChannelBuffer<short>_*,_false> __ptr;
  short *__dest;
  _Head_base<0UL,_webrtc::ChannelBuffer<short>_*,_false> this_01;
  short **ppsVar2;
  int16_t **ppiVar3;
  size_t channel;
  
  this->reference_copied_ = true;
  pCVar1 = (this->low_pass_reference_channels_)._M_t.
           super___uniq_ptr_impl<webrtc::ChannelBuffer<short>,_std::default_delete<webrtc::ChannelBuffer<short>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_webrtc::ChannelBuffer<short>_*,_std::default_delete<webrtc::ChannelBuffer<short>_>_>
           .super__Head_base<0UL,_webrtc::ChannelBuffer<short>_*,_false>._M_head_impl;
  if ((pCVar1 == (ChannelBuffer<short> *)0x0) || (pCVar1->num_channels_ != this->num_channels_)) {
    this_01._M_head_impl = (ChannelBuffer<short> *)operator_new(0x38);
    ChannelBuffer<short>::ChannelBuffer
              (this_01._M_head_impl,this->num_split_frames_,this->num_proc_channels_,1);
    this_00 = &this->low_pass_reference_channels_;
    __ptr._M_head_impl =
         (this_00->_M_t).
         super___uniq_ptr_impl<webrtc::ChannelBuffer<short>,_std::default_delete<webrtc::ChannelBuffer<short>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_webrtc::ChannelBuffer<short>_*,_std::default_delete<webrtc::ChannelBuffer<short>_>_>
         .super__Head_base<0UL,_webrtc::ChannelBuffer<short>_*,_false>._M_head_impl;
    (this_00->_M_t).
    super___uniq_ptr_impl<webrtc::ChannelBuffer<short>,_std::default_delete<webrtc::ChannelBuffer<short>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_webrtc::ChannelBuffer<short>_*,_std::default_delete<webrtc::ChannelBuffer<short>_>_>
    .super__Head_base<0UL,_webrtc::ChannelBuffer<short>_*,_false>._M_head_impl =
         this_01._M_head_impl;
    if (__ptr._M_head_impl != (ChannelBuffer<short> *)0x0) {
      std::default_delete<webrtc::ChannelBuffer<short>_>::operator()
                ((default_delete<webrtc::ChannelBuffer<short>_> *)this_00,__ptr._M_head_impl);
    }
  }
  if (this->num_proc_channels_ != 0) {
    channel = 0;
    do {
      ppsVar2 = ChannelBuffer<short>::channels
                          ((this->low_pass_reference_channels_)._M_t.
                           super___uniq_ptr_impl<webrtc::ChannelBuffer<short>,_std::default_delete<webrtc::ChannelBuffer<short>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_webrtc::ChannelBuffer<short>_*,_std::default_delete<webrtc::ChannelBuffer<short>_>_>
                           .super__Head_base<0UL,_webrtc::ChannelBuffer<short>_*,_false>.
                           _M_head_impl,0);
      __dest = ppsVar2[channel];
      ppiVar3 = split_bands_const(this,channel);
      memcpy(__dest,*ppiVar3,
             ((this->low_pass_reference_channels_)._M_t.
              super___uniq_ptr_impl<webrtc::ChannelBuffer<short>,_std::default_delete<webrtc::ChannelBuffer<short>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_webrtc::ChannelBuffer<short>_*,_std::default_delete<webrtc::ChannelBuffer<short>_>_>
              .super__Head_base<0UL,_webrtc::ChannelBuffer<short>_*,_false>._M_head_impl)->
             num_frames_per_band_ * 2);
      channel = channel + 1;
    } while (channel < this->num_proc_channels_);
  }
  return;
}

Assistant:

void AudioBuffer::CopyLowPassToReference() {
  reference_copied_ = true;
  if (!low_pass_reference_channels_.get() ||
      low_pass_reference_channels_->num_channels() != num_channels_) {
    low_pass_reference_channels_.reset(
        new ChannelBuffer<int16_t>(num_split_frames_,
                                   num_proc_channels_));
  }
  for (size_t i = 0; i < num_proc_channels_; i++) {
    memcpy(low_pass_reference_channels_->channels()[i],
           split_bands_const(i)[kBand0To8kHz],
           low_pass_reference_channels_->num_frames_per_band() *
               sizeof(split_bands_const(i)[kBand0To8kHz][0]));
  }
}